

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTexture.cpp
# Opt level: O3

bool __thiscall
sf::RenderTexture::create(RenderTexture *this,uint width,uint height,ContextSettings *settings)

{
  Texture *this_00;
  bool bVar1;
  int iVar2;
  RenderTextureImplFBO *this_01;
  ostream *poVar3;
  
  this_00 = &this->m_texture;
  Texture::setSrgb(this_00,settings->sRgbCapable);
  bVar1 = Texture::create(this_00,width,height);
  if (bVar1) {
    Texture::setSmooth(this_00,false);
    if (this->m_impl != (RenderTextureImpl *)0x0) {
      (*this->m_impl->_vptr_RenderTextureImpl[1])();
    }
    bVar1 = priv::RenderTextureImplFBO::isAvailable();
    if (bVar1) {
      this_01 = (RenderTextureImplFBO *)operator_new(0x88);
      priv::RenderTextureImplFBO::RenderTextureImplFBO(this_01);
      this->m_impl = (RenderTextureImpl *)this_01;
      (this->m_texture).m_fboAttachment = true;
    }
    else {
      this_01 = (RenderTextureImplFBO *)operator_new(0x18);
      priv::RenderTextureImplDefault::RenderTextureImplDefault((RenderTextureImplDefault *)this_01);
      this->m_impl = (RenderTextureImpl *)this_01;
    }
    iVar2 = (*(this_01->super_RenderTextureImpl)._vptr_RenderTextureImpl[2])
                      (this_01,(ulong)width,(ulong)height,(ulong)(this->m_texture).m_texture,
                       settings);
    if ((char)iVar2 != '\0') {
      RenderTarget::initialize(&this->super_RenderTarget);
      return true;
    }
  }
  else {
    poVar3 = err();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"Impossible to create render texture (failed to create the target texture)",
               0x49);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  return false;
}

Assistant:

bool RenderTexture::create(unsigned int width, unsigned int height, const ContextSettings& settings)
{
    // Set texture to be in sRGB scale if requested
    m_texture.setSrgb(settings.sRgbCapable);

    // Create the texture
    if (!m_texture.create(width, height))
    {
        err() << "Impossible to create render texture (failed to create the target texture)" << std::endl;
        return false;
    }

    // We disable smoothing by default for render textures
    setSmooth(false);

    // Create the implementation
    delete m_impl;
    if (priv::RenderTextureImplFBO::isAvailable())
    {
        // Use frame-buffer object (FBO)
        m_impl = new priv::RenderTextureImplFBO;

        // Mark the texture as being a framebuffer object attachment
        m_texture.m_fboAttachment = true;
    }
    else
    {
        // Use default implementation
        m_impl = new priv::RenderTextureImplDefault;
    }

    // Initialize the render texture
    if (!m_impl->create(width, height, m_texture.m_texture, settings))
        return false;

    // We can now initialize the render target part
    RenderTarget::initialize();

    return true;
}